

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_decoder.cc
# Opt level: O3

Status * __thiscall
draco::PlyDecoder::DecodeFaceData
          (Status *__return_storage_ptr__,PlyDecoder *this,PlyElement *face_element)

{
  _Rb_tree_header *p_Var1;
  int64_t iVar2;
  pointer plVar3;
  undefined1 *puVar4;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> IVar5;
  uint uVar6;
  const_iterator cVar7;
  ulong uVar8;
  undefined8 uVar9;
  long *plVar10;
  ThisIndexType ret;
  FaceIndex face_id;
  size_type __new_size;
  PlyProperty *property;
  long lVar11;
  size_type __new_size_00;
  long lVar12;
  long lVar13;
  bool bVar14;
  PlyPropertyReader<unsigned_int> vertex_index_reader;
  Face face;
  PlyPropertyReader<unsigned_int> local_a8;
  PlyDecoder *local_80;
  Face local_78;
  long local_68;
  value_type local_60;
  Status *local_50;
  ulong local_48;
  PlyProperty *local_40;
  ulong local_38;
  
  if (face_element == (PlyElement *)0x0) {
    __return_storage_ptr__->code_ = OK;
    (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->error_msg_).field_2;
    (__return_storage_ptr__->error_msg_)._M_string_length = 0;
    (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  puVar4 = (undefined1 *)((long)&local_a8.convert_value_func_.super__Function_base + 8);
  local_a8.property_ = (PlyProperty *)puVar4;
  local_80 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"vertex_indices","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(face_element->property_index_)._M_t,(key_type *)&local_a8);
  p_Var1 = &(face_element->property_index_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar7._M_node == p_Var1) {
    property = (pointer)0x0;
  }
  else {
    property = (face_element->properties_).
               super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>._M_impl.
               super__Vector_impl_data._M_start + (int)cVar7._M_node[2]._M_color;
  }
  if (local_a8.property_ != (PlyProperty *)puVar4) {
    operator_delete(local_a8.property_,
                    local_a8.convert_value_func_.super__Function_base._M_functor._8_8_ + 1);
  }
  if (property == (pointer)0x0) {
    local_a8.property_ = (PlyProperty *)puVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"vertex_index","");
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::find(&(face_element->property_index_)._M_t,(key_type *)&local_a8);
    if ((_Rb_tree_header *)cVar7._M_node == p_Var1) {
      property = (pointer)0x0;
    }
    else {
      property = (face_element->properties_).
                 super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>._M_impl
                 .super__Vector_impl_data._M_start + (int)cVar7._M_node[2]._M_color;
    }
    if (local_a8.property_ != (PlyProperty *)puVar4) {
      operator_delete(local_a8.property_,
                      local_a8.convert_value_func_.super__Function_base._M_functor._8_8_ + 1);
    }
    if (property == (pointer)0x0) goto LAB_00118da4;
  }
  if (property->list_data_type_ != DT_INVALID) {
    __new_size = 0;
    uVar6 = (uint)face_element->num_entries_;
    if ((int)uVar6 < 1) {
      __new_size_00 = 0;
    }
    else {
      uVar8 = (ulong)(uVar6 & 0x7fffffff);
      plVar10 = (property->list_data_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start + 1;
      __new_size_00 = 0;
      do {
        lVar13 = 0;
        if (2 < *plVar10) {
          lVar13 = *plVar10 + -2;
        }
        __new_size_00 = __new_size_00 + lVar13;
        plVar10 = plVar10 + 2;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
    local_a8.convert_value_func_.super__Function_base._M_functor._0_4_ = 0;
    local_a8.property_ = (PlyProperty *)0x0;
    std::
    vector<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
    ::resize(&(local_80->out_mesh_->faces_).vector_,__new_size_00,(value_type *)&local_a8);
    iVar2 = face_element->num_entries_;
    PlyPropertyReader<unsigned_int>::PlyPropertyReader(&local_a8,property);
    local_78._M_elems[2].value_ = 0;
    local_78._M_elems[0].value_ = 0;
    local_78._M_elems[1].value_ = 0;
    uVar6 = (uint)iVar2;
    if (0 < (int)uVar6) {
      local_48 = (ulong)(uVar6 & 0x7fffffff);
      uVar8 = 0;
      face_id.value_ = 0;
      local_50 = __return_storage_ptr__;
      local_40 = property;
      do {
        plVar3 = (local_40->list_data_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_68 = plVar3[uVar8 * 2 + 1];
        local_38 = uVar8;
        if (2 < local_68) {
          lVar13 = plVar3[uVar8 * 2];
          local_60._M_elems[0].value_ = (uint)lVar13;
          if (local_a8.convert_value_func_.super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_00118f9a:
            uVar9 = std::__throw_bad_function_call();
            __clang_call_terminate(uVar9);
          }
          IVar5.value_ = (*local_a8.convert_value_func_._M_invoker)
                                   ((_Any_data *)&local_a8.convert_value_func_,(int *)&local_60);
          local_78._M_elems[0].value_ = IVar5.value_;
          local_68 = local_68 + -3;
          lVar11 = 0;
          do {
            lVar12 = 1;
            do {
              local_60._M_elems[0].value_ = (int)lVar13 + (int)lVar12;
              if (local_a8.convert_value_func_.super__Function_base._M_manager == (_Manager_type)0x0
                 ) {
                std::__throw_bad_function_call();
                goto LAB_00118f9a;
              }
              uVar6 = (*local_a8.convert_value_func_._M_invoker)
                                ((_Any_data *)&local_a8.convert_value_func_,(int *)&local_60);
              local_78._M_elems[lVar12].value_ = uVar6;
              lVar12 = lVar12 + 1;
            } while (lVar12 != 3);
            Mesh::SetFace(local_80->out_mesh_,face_id,&local_78);
            face_id.value_ = face_id.value_ + 1;
            lVar13 = lVar13 + 1;
            bVar14 = lVar11 != local_68;
            lVar11 = lVar11 + 1;
          } while (bVar14);
        }
        uVar8 = local_38 + 1;
      } while (uVar8 != local_48);
      __new_size = (size_type)face_id.value_;
      __return_storage_ptr__ = local_50;
    }
    local_60._M_elems[2].value_ = 0;
    local_60._M_elems[0].value_ = 0;
    local_60._M_elems[1].value_ = 0;
    std::
    vector<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
    ::resize(&(local_80->out_mesh_->faces_).vector_,__new_size,&local_60);
    __return_storage_ptr__->code_ = OK;
    (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->error_msg_).field_2;
    (__return_storage_ptr__->error_msg_)._M_string_length = 0;
    (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
    if (local_a8.convert_value_func_.super__Function_base._M_manager == (_Manager_type)0x0) {
      return __return_storage_ptr__;
    }
    (*local_a8.convert_value_func_.super__Function_base._M_manager)
              ((_Any_data *)&local_a8.convert_value_func_,(_Any_data *)&local_a8.convert_value_func_
               ,__destroy_functor);
    return __return_storage_ptr__;
  }
LAB_00118da4:
  local_a8.property_ = (PlyProperty *)puVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"No faces defined","");
  __return_storage_ptr__->code_ = DRACO_ERROR;
  (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error_msg_).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->error_msg_,local_a8.property_,
             (undefined1 *)
             ((long)&((local_a8.property_)->name_)._M_dataplus +
             CONCAT44(local_a8.convert_value_func_.super__Function_base._M_functor._4_4_,
                      local_a8.convert_value_func_.super__Function_base._M_functor._0_4_)));
  if (local_a8.property_ != (PlyProperty *)puVar4) {
    operator_delete(local_a8.property_,
                    local_a8.convert_value_func_.super__Function_base._M_functor._8_8_ + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Status PlyDecoder::DecodeFaceData(const PlyElement *face_element) {
  // We accept point clouds now.
  if (face_element == nullptr) {
    return OkStatus();
  }
  const PlyProperty *vertex_indices =
      face_element->GetPropertyByName("vertex_indices");
  if (vertex_indices == nullptr) {
    // The property name may be named either "vertex_indices" or "vertex_index".
    vertex_indices = face_element->GetPropertyByName("vertex_index");
  }
  if (vertex_indices == nullptr || !vertex_indices->is_list()) {
    return Status(Status::DRACO_ERROR, "No faces defined");
  }

  // Allocate faces.
  out_mesh_->SetNumFaces(CountNumTriangles(*face_element, *vertex_indices));
  const int64_t num_polygons = face_element->num_entries();

  PlyPropertyReader<PointIndex::ValueType> vertex_index_reader(vertex_indices);
  Mesh::Face face;
  FaceIndex face_index(0);
  for (int i = 0; i < num_polygons; ++i) {
    const int64_t list_offset = vertex_indices->GetListEntryOffset(i);
    const int64_t list_size = vertex_indices->GetListEntryNumValues(i);
    if (list_size < 3) {
      continue;  // All invalid polygons are skipped.
    }

    // Triangulate polygon assuming the polygon is convex.
    const int64_t num_triangles = list_size - 2;
    face[0] = vertex_index_reader.ReadValue(static_cast<int>(list_offset));
    for (int64_t ti = 0; ti < num_triangles; ++ti) {
      for (int64_t c = 1; c < 3; ++c) {
        face[c] = vertex_index_reader.ReadValue(
            static_cast<int>(list_offset + ti + c));
      }
      out_mesh_->SetFace(face_index, face);
      face_index++;
    }
  }
  out_mesh_->SetNumFaces(face_index.value());
  return OkStatus();
}